

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O1

void __thiscall crnlib::qdxt5::~qdxt5(qdxt5 *this)

{
  long lVar1;
  void *pvVar2;
  vector<unsigned_int> *pvVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  spinlock::~spinlock(&this->m_cluster_hash_lock);
  hash_map<crnlib::qdxt5::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt5::cluster_id>,_crnlib::equal_to<crnlib::qdxt5::cluster_id>_>
  ::~hash_map(&this->m_cluster_hash);
  lVar7 = 0x18e0;
  do {
    lVar1 = *(long *)((long)(this->m_params).m_mip_desc + lVar7 + -0x58);
    lVar6 = lVar7 + -0x10;
    if (lVar1 != 0) {
      uVar4 = (ulong)*(uint *)((long)(this->m_params).m_mip_desc + lVar7 + -0x50);
      if (uVar4 != 0) {
        lVar5 = 0;
        do {
          pvVar2 = *(void **)(lVar1 + lVar5);
          if (pvVar2 != (void *)0x0) {
            crnlib_free(pvVar2);
          }
          lVar5 = lVar5 + 0x10;
        } while (uVar4 << 4 != lVar5);
      }
      crnlib_free(*(void **)((long)(this->m_params).m_mip_desc + lVar7 + -0x58));
    }
    lVar7 = lVar6;
  } while (lVar6 != 0x8e0);
  lVar7 = 0;
  do {
    clusterizer<crnlib::vec<16U,_float>_>::~clusterizer
              ((clusterizer<crnlib::vec<16U,_float>_> *)
               ((long)&(this->m_selector_clusterizer).m_clusterizers[3].m_training_vecs.m_p + lVar7)
              );
    lVar7 = lVar7 + -0x70;
  } while (lVar7 != -0x1c0);
  pvVar3 = (this->m_endpoint_cluster_indices).m_p;
  if (pvVar3 != (vector<unsigned_int> *)0x0) {
    uVar4 = (ulong)(this->m_endpoint_cluster_indices).m_size;
    if (uVar4 != 0) {
      lVar7 = 0;
      do {
        pvVar2 = *(void **)((long)&pvVar3->m_p + lVar7);
        if (pvVar2 != (void *)0x0) {
          crnlib_free(pvVar2);
        }
        lVar7 = lVar7 + 0x10;
      } while (uVar4 << 4 != lVar7);
    }
    crnlib_free((this->m_endpoint_cluster_indices).m_p);
  }
  clusterizer<crnlib::vec<2U,_float>_>::~clusterizer(&this->m_endpoint_clusterizer);
  return;
}

Assistant:

qdxt5::~qdxt5() {
}